

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

size_t __thiscall SignerAttribute::SetDataSize(SignerAttribute *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  sVar2 = GetDataSize<Attribute>(&this->claimedAttributes);
  uVar1 = (this->certifiedAttributes).super_DerBase.cbData;
  lVar4 = 2;
  if ((((0x7f < uVar1) && (lVar4 = 3, 0xff < uVar1)) && (lVar4 = 4, 0xffff < uVar1)) &&
     (((lVar4 = 5, 0xffffff < uVar1 && (lVar4 = 6, uVar1 >> 0x20 != 0)) &&
      (lVar4 = 7, uVar1 >> 0x28 != 0)))) {
    lVar4 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  sVar3 = 2;
  if (sVar2 != 0) {
    sVar3 = sVar2;
  }
  sVar2 = sVar3 + uVar1 + lVar4;
  (this->super_DerBase).cbData = sVar2;
  return sVar2;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = GetEncodedSize(claimedAttributes) + certifiedAttributes.EncodedSize();
		return cbData;
	}